

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O2

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  unsigned_long uVar1;
  pointer pcVar2;
  pointer pcVar3;
  cmGraphEdge *ni;
  pointer pcVar4;
  bool local_4a;
  bool local_49;
  long local_48;
  long local_40;
  size_t j_component;
  
  local_48 = ((long)(this->InputGraph->
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->InputGraph->
                   super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                   super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18;
  for (local_40 = 0; local_40 != local_48; local_40 = local_40 + 1) {
    uVar1 = (this->TarjanComponents).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_40];
    pcVar2 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = *(pointer *)((long)(pcVar2 + local_40) + 8);
    for (pcVar4 = *(pointer *)
                   &pcVar2[local_40].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        pcVar4 != pcVar3; pcVar4 = pcVar4 + 1) {
      j_component = (this->TarjanComponents).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[pcVar4->Dest];
      if (uVar1 != j_component) {
        local_49 = pcVar4->Strong;
        local_4a = pcVar4->Cross;
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace_const&>
                  ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                   ((this->ComponentGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar1),&j_component,&local_49,&local_4a,
                   &pcVar4->Backtrace);
      }
    }
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  size_t n = this->InputGraph.size();
  for (size_t i = 0; i < n; ++i) {
    size_t i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (cmGraphEdge const& ni : nl) {
      size_t j = ni;
      size_t j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].emplace_back(
          j_component, ni.IsStrong(), ni.IsCross(), ni.GetBacktrace());
      }
    }
  }
}